

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_wait_mips64(CPUMIPSState_conflict5 *env)

{
  CPUState *cpu;
  CPUState *cs;
  CPUMIPSState_conflict5 *env_local;
  
  cpu = env_cpu(env);
  cpu->halted = 1;
  cpu_reset_interrupt(cpu,0x100);
  raise_exception(env,0x10001);
  return;
}

Assistant:

void helper_wait(CPUMIPSState *env)
{
    CPUState *cs = env_cpu(env);

    cs->halted = 1;
    cpu_reset_interrupt(cs, CPU_INTERRUPT_WAKE);
    /*
     * Last instruction in the block, PC was updated before
     * - no need to recover PC and icount.
     */
    raise_exception(env, EXCP_HLT);
}